

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O3

bool __thiscall Uniforms::feedTo(Uniforms *this,Shader *_shader,bool _lights,bool _buffers)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Texture *_tex;
  size_t sVar4;
  UniformFunctionsMap *pUVar5;
  Uniforms *pUVar6;
  int iVar7;
  int iVar8;
  GLuint _textureId;
  _Rb_tree_node_base *p_Var9;
  undefined8 extraout_RAX;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  long *plVar12;
  ulong uVar13;
  Fbo *pFVar14;
  float *pfVar15;
  undefined7 in_register_00000009;
  size_type *psVar16;
  undefined7 in_register_00000011;
  ulong uVar17;
  byte bVar18;
  uint uVar19;
  long lVar20;
  undefined8 uVar21;
  iterator it;
  float fVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string local_d8;
  string local_b8;
  Uniforms *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  uint local_70;
  undefined4 local_6c;
  unsigned_long local_68;
  undefined4 local_5c;
  string local_58;
  _Rb_tree_node_base *local_38;
  
  local_5c = (undefined4)CONCAT71(in_register_00000009,_buffers);
  local_6c = (undefined4)CONCAT71(in_register_00000011,_lights);
  p_Var9 = (this->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  pUVar5 = &this->functions;
  do {
    local_98 = this;
    if ((_Rb_tree_header *)p_Var9 == &(pUVar5->_M_t)._M_impl.super__Rb_tree_header) {
      bVar18 = 0;
      uVar19 = 0;
      for (p_Var9 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        vera::Shader::setUniform
                  (_shader,(string *)(p_Var9 + 1),(float *)&p_Var9[4]._M_left,
                   *(size_t *)(p_Var9 + 5));
        bVar18 = bVar18 | *(byte *)((long)&p_Var9[5]._M_parent + 1);
        uVar19 = (uint)bVar18;
      }
      local_70 = uVar19;
      for (p_Var9 = (this->sequences)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &(this->sequences)._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
        lVar20 = (long)p_Var9[2]._M_parent - *(long *)(p_Var9 + 2);
        if (lVar20 != 0) {
          lVar20 = *(long *)(p_Var9 + 2) +
                   (this->m_frame % (ulong)((lVar20 >> 4) * 0x6db6db6db6db6db7)) * 0x70;
          vera::Shader::setUniform
                    (_shader,(string *)(p_Var9 + 1),(float *)(lVar20 + 0x50),
                     *(size_t *)(lVar20 + 0x60));
          local_70 = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
        }
      }
      p_Var10 = (this->super_Scene).textures._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var2 = &(this->super_Scene).textures._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var10 != p_Var2) {
        do {
          _tex = *(Texture **)(p_Var10 + 2);
          sVar4 = _shader->textureIndex;
          _shader->textureIndex = sVar4 + 1;
          vera::Shader::setUniformTexture(_shader,(string *)(p_Var10 + 1),_tex,sVar4);
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          iVar7 = (**(code **)(**(long **)(p_Var10 + 2) + 0x60))();
          iVar8 = (**(code **)(**(long **)(p_Var10 + 2) + 0x68))();
          vera::Shader::setUniform(_shader,&local_d8,(float)iVar7,(float)iVar8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while ((_Rb_tree_header *)p_Var10 != p_Var2);
      }
      p_Var10 = (local_98->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      local_38 = &(local_98->super_Scene).streams._M_t._M_impl.super__Rb_tree_header._M_header;
      if (p_Var10 != local_38) {
        paVar3 = &local_d8.field_2;
        do {
          local_68 = 0;
          lVar20 = (**(code **)(**(long **)(p_Var10 + 2) + 0xa0))();
          if (lVar20 != 0) {
            do {
              local_90 = local_80;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,*(long *)(p_Var10 + 1),
                         (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
              std::__cxx11::string::append((char *)&local_90);
              vera::toString<unsigned_long>(&local_58,&local_68);
              uVar13 = 0xf;
              if (local_90 != local_80) {
                uVar13 = local_80[0];
              }
              if (uVar13 < local_58._M_string_length + local_88) {
                uVar21 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_58._M_dataplus._M_p != &local_58.field_2) {
                  uVar21 = local_58.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar21 < local_58._M_string_length + local_88) goto LAB_001d9108;
                puVar11 = (undefined8 *)
                          std::__cxx11::string::replace
                                    ((ulong)&local_58,0,(char *)0x0,(ulong)local_90);
              }
              else {
LAB_001d9108:
                puVar11 = (undefined8 *)
                          std::__cxx11::string::_M_append
                                    ((char *)&local_90,(ulong)local_58._M_dataplus._M_p);
              }
              psVar16 = puVar11 + 2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*puVar11 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_b8.field_2._M_allocated_capacity = *psVar16;
                local_b8.field_2._8_8_ = puVar11[3];
                local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
              }
              else {
                local_b8.field_2._M_allocated_capacity = *psVar16;
                local_b8._M_dataplus._M_p = (pointer)*puVar11;
              }
              local_b8._M_string_length = puVar11[1];
              *puVar11 = psVar16;
              puVar11[1] = 0;
              *(undefined1 *)psVar16 = 0;
              plVar12 = (long *)std::__cxx11::string::append((char *)&local_b8);
              psVar16 = (size_type *)(plVar12 + 2);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar12 ==
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)psVar16) {
                local_d8.field_2._M_allocated_capacity = *psVar16;
                local_d8.field_2._8_8_ = plVar12[3];
                local_d8._M_dataplus._M_p = (pointer)paVar3;
              }
              else {
                local_d8.field_2._M_allocated_capacity = *psVar16;
                local_d8._M_dataplus._M_p = (pointer)*plVar12;
              }
              local_d8._M_string_length = plVar12[1];
              *plVar12 = (long)psVar16;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              _textureId = (**(code **)(**(long **)(p_Var10 + 2) + 0xa8))
                                     (*(long **)(p_Var10 + 2),local_68);
              sVar4 = _shader->textureIndex;
              _shader->textureIndex = sVar4 + 1;
              vera::Shader::setUniformTexture(_shader,&local_d8,_textureId,sVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != paVar3) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
              if (local_90 != local_80) {
                operator_delete(local_90,local_80[0] + 1);
              }
              uVar17 = local_68 + 1;
              local_68 = uVar17;
              uVar13 = (**(code **)(**(long **)(p_Var10 + 2) + 0xa0))();
            } while (uVar17 < uVar13);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          fVar22 = (float)(**(code **)(**(long **)(p_Var10 + 2) + 0xd0))();
          vera::Shader::setUniform(_shader,&local_d8,fVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          fVar22 = (float)(**(code **)(**(long **)(p_Var10 + 2) + 0xc0))();
          vera::Shader::setUniform(_shader,&local_d8,fVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          fVar22 = (float)(**(code **)(**(long **)(p_Var10 + 2) + 200))();
          vera::Shader::setUniform(_shader,&local_d8,fVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          fVar22 = (float)(**(code **)(**(long **)(p_Var10 + 2) + 0xe8))();
          vera::Shader::setUniform(_shader,&local_d8,fVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_d8,*(long *)(p_Var10 + 1),
                     (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
          std::__cxx11::string::append((char *)&local_d8);
          fVar22 = (float)(**(code **)(**(long **)(p_Var10 + 2) + 0xe0))();
          vera::Shader::setUniform(_shader,&local_d8,fVar22);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != local_38);
      }
      if ((char)local_5c != '\0') {
        local_90 = (ulong *)0x0;
        if ((local_98->buffers).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            (local_98->buffers).super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          do {
            vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_90);
            plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2e0629)
            ;
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8.field_2._8_8_ = plVar12[3];
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_d8._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            pFVar14 = (local_98->buffers).
                      super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_90];
            sVar4 = _shader->textureIndex;
            _shader->textureIndex = sVar4 + 1;
            vera::Shader::setUniformTexture(_shader,&local_d8,pFVar14,sVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_90 = (ulong *)((long)local_90 + 1);
          } while (local_90 <
                   (ulong *)((long)(local_98->buffers).
                                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_98->buffers).
                                   super__Vector_base<vera::Fbo_*,_std::allocator<vera::Fbo_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
        }
        local_90 = (ulong *)0x0;
        if ((local_98->doubleBuffers).
            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            (local_98->doubleBuffers).
            super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>._M_impl.
            super__Vector_impl_data._M_start) {
          do {
            vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_90);
            plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2e0644)
            ;
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8.field_2._8_8_ = plVar12[3];
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_d8._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            pFVar14 = (local_98->doubleBuffers).
                      super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[(long)local_90]->src;
            sVar4 = _shader->textureIndex;
            _shader->textureIndex = sVar4 + 1;
            vera::Shader::setUniformTexture(_shader,&local_d8,pFVar14,sVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_90 = (ulong *)((long)local_90 + 1);
          } while (local_90 <
                   (ulong *)((long)(local_98->doubleBuffers).
                                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(local_98->doubleBuffers).
                                   super__Vector_base<vera::PingPong_*,_std::allocator<vera::PingPong_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
        }
        local_90 = (ulong *)0x0;
        if ((local_98->floods).super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl
            .super__Vector_impl_data._M_finish !=
            (local_98->floods).super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl
            .super__Vector_impl_data._M_start) {
          do {
            vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_90);
            plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2deec7)
            ;
            psVar16 = (size_type *)(plVar12 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar12 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar16) {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8.field_2._8_8_ = plVar12[3];
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
            }
            else {
              local_d8.field_2._M_allocated_capacity = *psVar16;
              local_d8._M_dataplus._M_p = (pointer)*plVar12;
            }
            local_d8._M_string_length = plVar12[1];
            *plVar12 = (long)psVar16;
            plVar12[1] = 0;
            *(undefined1 *)(plVar12 + 2) = 0;
            pFVar14 = (local_98->floods).
                      super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>._M_impl.
                      super__Vector_impl_data._M_start[(long)local_90].super_PingPong.dst;
            sVar4 = _shader->textureIndex;
            _shader->textureIndex = sVar4 + 1;
            vera::Shader::setUniformTexture(_shader,&local_d8,pFVar14,sVar4);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
              operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
            }
            local_90 = (ulong *)((long)local_90 + 1);
          } while (local_90 <
                   (ulong *)(((long)(local_98->floods).
                                    super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_98->floods).
                                    super__Vector_base<vera::Flood,_std::allocator<vera::Flood>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 6) *
                            -0x5555555555555555));
        }
      }
      local_90 = (ulong *)0x0;
      if ((local_98->pyramids).super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (local_98->pyramids).super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        do {
          vera::toString<unsigned_long>(&local_b8,(unsigned_long *)&local_90);
          plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x2e0665);
          psVar16 = (size_type *)(plVar12 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar12 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar16) {
            local_d8.field_2._M_allocated_capacity = *psVar16;
            local_d8.field_2._8_8_ = plVar12[3];
            local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          }
          else {
            local_d8.field_2._M_allocated_capacity = *psVar16;
            local_d8._M_dataplus._M_p = (pointer)*plVar12;
          }
          local_d8._M_string_length = plVar12[1];
          *plVar12 = (long)psVar16;
          plVar12[1] = 0;
          *(undefined1 *)(plVar12 + 2) = 0;
          pFVar14 = vera::Pyramid::getResult
                              ((local_98->pyramids).
                               super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                               _M_impl.super__Vector_impl_data._M_start + (long)local_90,0);
          sVar4 = _shader->textureIndex;
          _shader->textureIndex = sVar4 + 1;
          vera::Shader::setUniformTexture(_shader,&local_d8,pFVar14,sVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          local_90 = (ulong *)((long)local_90 + 1);
        } while (local_90 <
                 (ulong *)(((long)(local_98->pyramids).
                                  super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                            (long)(local_98->pyramids).
                                  super__Vector_base<vera::Pyramid,_std::allocator<vera::Pyramid>_>.
                                  _M_impl.super__Vector_impl_data._M_start >> 7) *
                          0x2e8ba2e8ba2e8ba3));
      }
      bVar18 = (byte)local_70;
      if ((char)local_6c != '\0') {
        p_Var10 = (local_98->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_header.
                  _M_left;
        if ((local_98->super_Scene).lights._M_t._M_impl.super__Rb_tree_header._M_node_count == 1) {
          paVar3 = &local_d8.field_2;
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_lightColor","");
          lVar20 = *(long *)(p_Var10 + 2);
          vera::Shader::setUniform
                    (_shader,&local_d8,*(float *)(lVar20 + 0xb0),*(float *)(lVar20 + 0xb4),
                     *(float *)(lVar20 + 0xb8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_lightIntensity","")
          ;
          vera::Shader::setUniform(_shader,&local_d8,*(float *)(*(long *)(p_Var10 + 2) + 200));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_light","");
          pfVar15 = (float *)(**(code **)(**(long **)(p_Var10 + 2) + 0x98))();
          vera::Shader::setUniform(_shader,&local_d8,*pfVar15,pfVar15[1],pfVar15[2]);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          lVar20 = *(long *)(p_Var10 + 2);
          if ((*(uint *)(lVar20 + 0x210) & 0xfffffffd) == 0) {
            local_d8._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_d8,"u_lightDirection","");
            lVar20 = *(long *)(p_Var10 + 2);
            vera::Shader::setUniform
                      (_shader,&local_d8,*(float *)(lVar20 + 0xbc),*(float *)(lVar20 + 0xc0),
                       *(float *)(lVar20 + 0xc4));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar3) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
            lVar20 = *(long *)(p_Var10 + 2);
          }
          if (0.0 < *(float *)(lVar20 + 0xcc)) {
            local_d8._M_dataplus._M_p = (pointer)paVar3;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_lightFalloff","")
            ;
            vera::Shader::setUniform(_shader,&local_d8,*(float *)(*(long *)(p_Var10 + 2) + 0xcc));
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != paVar3) {
              operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
            }
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_lightMatrix","");
          vera::Shader::setUniform(_shader,&local_d8,(mat4 *)(*(long *)(p_Var10 + 2) + 0x1c8),false)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_lightShadowMap","")
          ;
          lVar20 = *(long *)(p_Var10 + 2);
          sVar4 = _shader->textureIndex;
          _shader->textureIndex = sVar4 + 1;
          vera::Shader::setUniformDepthTexture(_shader,&local_d8,(Fbo *)(lVar20 + 0xd0),sVar4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          p_Var2 = &(local_98->super_Scene).lights._M_t._M_impl.super__Rb_tree_header;
          if ((_Rb_tree_header *)p_Var10 != p_Var2) {
            paVar3 = &local_b8.field_2;
            do {
              std::operator+(&local_d8,"u_",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             (p_Var10 + 1));
              local_b8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,local_d8._M_dataplus._M_p,
                         local_d8._M_dataplus._M_p + local_d8._M_string_length);
              std::__cxx11::string::append((char *)&local_b8);
              lVar20 = *(long *)(p_Var10 + 2);
              vera::Shader::setUniform
                        (_shader,&local_b8,*(float *)(lVar20 + 0xb0),*(float *)(lVar20 + 0xb4),
                         *(float *)(lVar20 + 0xb8));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              local_b8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,local_d8._M_dataplus._M_p,
                         local_d8._M_dataplus._M_p + local_d8._M_string_length);
              std::__cxx11::string::append((char *)&local_b8);
              vera::Shader::setUniform(_shader,&local_b8,*(float *)(*(long *)(p_Var10 + 2) + 200));
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              pfVar15 = (float *)(**(code **)(**(long **)(p_Var10 + 2) + 0x98))();
              vera::Shader::setUniform(_shader,&local_d8,*pfVar15,pfVar15[1],pfVar15[2]);
              lVar20 = *(long *)(p_Var10 + 2);
              if ((*(uint *)(lVar20 + 0x210) & 0xfffffffd) == 0) {
                local_b8._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b8,local_d8._M_dataplus._M_p,
                           local_d8._M_dataplus._M_p + local_d8._M_string_length);
                std::__cxx11::string::append((char *)&local_b8);
                lVar20 = *(long *)(p_Var10 + 2);
                vera::Shader::setUniform
                          (_shader,&local_b8,*(float *)(lVar20 + 0xbc),*(float *)(lVar20 + 0xc0),
                           *(float *)(lVar20 + 0xc4));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
                lVar20 = *(long *)(p_Var10 + 2);
              }
              if (0.0 < *(float *)(lVar20 + 0xcc)) {
                local_b8._M_dataplus._M_p = (pointer)paVar3;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_b8,local_d8._M_dataplus._M_p,
                           local_d8._M_dataplus._M_p + local_d8._M_string_length);
                std::__cxx11::string::append((char *)&local_b8);
                vera::Shader::setUniform
                          (_shader,&local_b8,*(float *)(*(long *)(p_Var10 + 2) + 0xcc));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._M_dataplus._M_p != paVar3) {
                  operator_delete(local_b8._M_dataplus._M_p,
                                  local_b8.field_2._M_allocated_capacity + 1);
                }
              }
              local_b8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,local_d8._M_dataplus._M_p,
                         local_d8._M_dataplus._M_p + local_d8._M_string_length);
              std::__cxx11::string::append((char *)&local_b8);
              vera::Shader::setUniform
                        (_shader,&local_b8,(mat4 *)(*(long *)(p_Var10 + 2) + 0x1c8),false);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              local_b8._M_dataplus._M_p = (pointer)paVar3;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b8,local_d8._M_dataplus._M_p,
                         local_d8._M_dataplus._M_p + local_d8._M_string_length);
              std::__cxx11::string::append((char *)&local_b8);
              lVar20 = *(long *)(p_Var10 + 2);
              sVar4 = _shader->textureIndex;
              _shader->textureIndex = sVar4 + 1;
              vera::Shader::setUniformDepthTexture(_shader,&local_b8,(Fbo *)(lVar20 + 0xd0),sVar4);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_dataplus._M_p != paVar3) {
                operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1
                               );
              }
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
            } while ((_Rb_tree_header *)p_Var10 != p_Var2);
          }
        }
        pUVar6 = local_98;
        bVar18 = (byte)local_70;
        if ((local_98->super_Scene).activeCubemap != (TextureCube *)0x0) {
          paVar3 = &local_d8.field_2;
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_cubeMap","");
          vera::Shader::setUniformTextureCube(_shader,&local_d8,(pUVar6->super_Scene).activeCubemap)
          ;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
          local_d8._M_dataplus._M_p = (pointer)paVar3;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"u_SH","");
          vera::Shader::setUniform(_shader,&local_d8,((pUVar6->super_Scene).activeCubemap)->SH,9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != paVar3) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
      }
      return (bool)(bVar18 & 1);
    }
    if ((char)local_6c == '\0') {
      p_Var1 = p_Var9 + 1;
      iVar7 = std::__cxx11::string::compare((char *)p_Var1);
      if ((((iVar7 != 0) && (iVar7 = std::__cxx11::string::compare((char *)p_Var1), iVar7 != 0)) &&
          (iVar7 = std::__cxx11::string::compare((char *)p_Var1), iVar7 != 0)) &&
         (iVar7 = std::__cxx11::string::compare((char *)p_Var1), iVar7 != 0)) goto LAB_001d8e3f;
    }
    else {
LAB_001d8e3f:
      if (((char)p_Var9[5]._M_color == _S_black) && (p_Var9[2]._M_left != (_Base_ptr)0x0)) {
        (*(code *)p_Var9[2]._M_right)(p_Var9 + 2,_shader);
      }
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    this = local_98;
  } while( true );
}

Assistant:

bool Uniforms::feedTo(vera::Shader *_shader, bool _lights, bool _buffers ) {
    bool update = false;

    // Pass native uniforms functions (u_time, u_data, etc...)
    for (UniformFunctionsMap::iterator it = functions.begin(); it != functions.end(); ++it) {
        if (!_lights && ( it->first == "u_scene" || it->first == "u_sceneDepth" || it->first == "u_sceneNormal" || it->first == "u_scenePosition") )
            continue;

        if (it->second.present)
            if (it->second.assign)
                it->second.assign( *_shader );
    }

    // Pass user defined uniforms (only if the shader code or scene had changed)
    // if (m_change) 
    {
        for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it) {
            _shader->setUniform(it->first, it->second.value.data(), it->second.size);
            if (it->second.change) {
                update += true;
            }
        }
    }

    // Pass sequence uniforms (the change every frame)
    for (UniformSequenceMap::iterator it = sequences.begin(); it != sequences.end(); ++it) {
        if (it->second.size() > 0) {
            size_t frame = m_frame % it->second.size();
            _shader->setUniform(it->first, it->second[frame].value.data(), it->second[frame].size);
            update += true;
        }
    }

    // Pass Textures Uniforms
    for (vera::TexturesMap::iterator it = textures.begin(); it != textures.end(); ++it) {
        _shader->setUniformTexture(it->first, it->second, _shader->textureIndex++ );
        _shader->setUniform(it->first+"Resolution", float(it->second->getWidth()), float(it->second->getHeight()));
    }

    for (vera::TextureStreamsMap::iterator it = streams.begin(); it != streams.end(); ++it) {
        for (size_t i = 0; i < it->second->getPrevTexturesTotal(); i++)
            _shader->setUniformTexture(it->first+"Prev["+vera::toString(i)+"]", it->second->getPrevTextureId(i), _shader->textureIndex++);

        _shader->setUniform(it->first+"Time", float(it->second->getTime()));
        _shader->setUniform(it->first+"Fps", float(it->second->getFps()));
        _shader->setUniform(it->first+"Duration", float(it->second->getDuration()));
        _shader->setUniform(it->first+"CurrentFrame", float(it->second->getCurrentFrame()));
        _shader->setUniform(it->first+"TotalFrames", float(it->second->getTotalFrames()));
    }

    // Pass Buffers Texture
    if (_buffers) {
        for (size_t i = 0; i < buffers.size(); i++)
            _shader->setUniformTexture("u_buffer" + vera::toString(i), buffers[i], _shader->textureIndex++ );

        for (size_t i = 0; i < doubleBuffers.size(); i++)
            _shader->setUniformTexture("u_doubleBuffer" + vera::toString(i), doubleBuffers[i]->src, _shader->textureIndex++ );
    
        for (size_t i = 0; i < floods.size(); i++)
            _shader->setUniformTexture("u_flood" + vera::toString(i), floods[i].dst, _shader->textureIndex++ );
    }

    // Pass Convolution Piramids resultant Texture
    for (size_t i = 0; i < pyramids.size(); i++)
        _shader->setUniformTexture("u_pyramid" + vera::toString(i), pyramids[i].getResult(), _shader->textureIndex++ );

    
    if (_lights) {
        // Pass Light Uniforms
        if (lights.size() == 1) {
            vera::LightsMap::iterator it = lights.begin();
            _shader->setUniform("u_lightColor", it->second->color);
            _shader->setUniform("u_lightIntensity", it->second->intensity);
            // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
            _shader->setUniform("u_light", it->second->getPosition());
            if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                _shader->setUniform("u_lightDirection", it->second->direction);
            if (it->second->falloff > 0)
                _shader->setUniform("u_lightFalloff", it->second->falloff);
            _shader->setUniform("u_lightMatrix", it->second->getBiasMVPMatrix() );
            _shader->setUniformDepthTexture("u_lightShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
        }
        else {
            // TODO:
            //      - Lights should be pass as structs?? 

            for (vera::LightsMap::iterator it = lights.begin(); it != lights.end(); ++it) {
                std::string name = "u_" + it->first;

                _shader->setUniform(name + "Color", it->second->color);
                _shader->setUniform(name + "Intensity", it->second->intensity);
                // if (it->second->getLightType() != vera::LIGHT_DIRECTIONAL)
                _shader->setUniform(name, it->second->getPosition());
                if (it->second->getLightType() == vera::LIGHT_DIRECTIONAL || it->second->getLightType() == vera::LIGHT_SPOT)
                    _shader->setUniform(name + "Direction", it->second->direction);
                if (it->second->falloff > 0)
                    _shader->setUniform(name +"Falloff", it->second->falloff);

                _shader->setUniform(name + "Matrix", it->second->getBiasMVPMatrix() );
                _shader->setUniformDepthTexture(name + "ShadowMap", it->second->getShadowMap(), _shader->textureIndex++ );
            }
        }
        
        if (activeCubemap) {
            _shader->setUniformTextureCube("u_cubeMap", (vera::TextureCube*)activeCubemap);
            _shader->setUniform("u_SH", activeCubemap->SH, 9);
        }
    }
    return update;
}